

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O0

Query * q_optimize(Query *q)

{
  bool bVar1;
  QueryType *pQVar2;
  Query *in_RSI;
  Query *in_RDI;
  bool changed;
  Query *in_stack_fffffffffffffdd8;
  Query *q_00;
  Query *in_stack_fffffffffffffdf8;
  bool *in_stack_fffffffffffffec0;
  Query *in_stack_fffffffffffffec8;
  Query *in_stack_fffffffffffffee8;
  bool *in_stack_ffffffffffffff00;
  Query *in_stack_ffffffffffffff08;
  bool *in_stack_ffffffffffffff50;
  Query *in_stack_ffffffffffffff58;
  
  q_00 = in_RDI;
  pQVar2 = Query::get_type(in_RSI);
  if (*pQVar2 == PRIMITIVE) {
    Query::Query(in_RDI,in_stack_fffffffffffffdd8);
  }
  else {
    simplify_subqueries(in_stack_fffffffffffffee8);
    Query::operator=(in_RDI,in_stack_fffffffffffffdd8);
    Query::~Query(in_RDI);
    bVar1 = true;
    while (bVar1) {
      bVar1 = false;
      flatten_trivial_operations(q_00,(bool *)in_RDI);
      Query::operator=(in_RDI,in_stack_fffffffffffffdd8);
      Query::~Query(in_RDI);
      inline_suboperations(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      Query::operator=(in_RDI,in_stack_fffffffffffffdd8);
      Query::~Query(in_RDI);
      deduplicate_primitives(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      Query::operator=(in_RDI,in_stack_fffffffffffffdd8);
      Query::~Query(in_RDI);
      simplify_minof(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      Query::operator=(in_RDI,in_stack_fffffffffffffdd8);
      Query::~Query(in_RDI);
      propagate_degenerate_queries(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      Query::operator=(in_RDI,in_stack_fffffffffffffdd8);
      Query::~Query(in_RDI);
    }
    reorder_subqueries(in_stack_fffffffffffffdf8);
    Query::operator=(in_RDI,in_stack_fffffffffffffdd8);
    Query::~Query(in_RDI);
    Query::Query(in_RDI,in_stack_fffffffffffffdd8);
  }
  return q_00;
}

Assistant:

Query q_optimize(Query &&q) {
    if (q.get_type() == QueryType::PRIMITIVE) {
        // Nothing to improve here.
        return std::move(q);
    }

    q = simplify_subqueries(std::move(q));
    bool changed = true;
    while (changed) {
        changed = false;
        q = flatten_trivial_operations(std::move(q), &changed);
        q = inline_suboperations(std::move(q), &changed);
        q = deduplicate_primitives(std::move(q), &changed);
        q = simplify_minof(std::move(q), &changed);
        q = propagate_degenerate_queries(std::move(q), &changed);
    }
    q = reorder_subqueries(std::move(q));
    return std::move(q);
}